

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::str_writer<fmt::v5::char8_t>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
           *this,align_spec *spec,str_writer<fmt::v5::char8_t> *f)

{
  undefined1 uVar1;
  wchar_t wVar2;
  alignment aVar3;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *this_00;
  unsigned_long __n;
  char8_t *pcVar4;
  char8_t *pcVar5;
  str_writer<fmt::v5::char8_t> *in_RDX;
  align_spec *in_RSI;
  size_t left_padding;
  size_t padding;
  char_type fill;
  type *it;
  size_t num_code_points;
  size_t size;
  uint width;
  char8_t **in_stack_ffffffffffffff88;
  str_writer<fmt::v5::char8_t> *in_stack_ffffffffffffff90;
  char8_t *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  type local_48;
  type *local_40;
  type local_38;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *local_30;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
  *local_28;
  uint local_1c;
  str_writer<fmt::v5::char8_t> *local_18;
  align_spec *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_1c = align_spec::width(in_RSI);
  this_00 = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
             *)basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
               ::str_writer<fmt::v5::char8_t>::size(local_18);
  local_28 = this_00;
  if (local_1c != 0) {
    this_00 = (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
               *)basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
                 ::str_writer<fmt::v5::char8_t>::width(in_stack_ffffffffffffff90);
  }
  local_30 = this_00;
  if (this_00 < (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
                 *)(ulong)local_1c) {
    local_48 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
               ::reserve(this_00,(size_t)in_stack_ffffffffffffff88);
    local_40 = &local_48;
    wVar2 = align_spec::fill(local_10);
    uVar1 = (undefined1)wVar2;
    __n = (ulong)local_1c - (long)local_30;
    aVar3 = align_spec::align(local_10);
    if (aVar3 == ALIGN_RIGHT) {
      pcVar4 = std::fill_n<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                         ((char8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),__n,
                          in_stack_ffffffffffffffa0);
      *local_40 = pcVar4;
      str_writer<fmt::v5::char8_t>::operator()
                ((str_writer<fmt::v5::char8_t> *)this_00,in_stack_ffffffffffffff88);
    }
    else {
      aVar3 = align_spec::align(local_10);
      if (aVar3 == ALIGN_CENTER) {
        pcVar4 = (char8_t *)(__n >> 1);
        pcVar5 = std::fill_n<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                           ((char8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),__n,pcVar4);
        *local_40 = pcVar5;
        str_writer<fmt::v5::char8_t>::operator()
                  ((str_writer<fmt::v5::char8_t> *)this_00,in_stack_ffffffffffffff88);
        pcVar4 = std::fill_n<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                           ((char8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),__n,pcVar4);
        *local_40 = pcVar4;
      }
      else {
        str_writer<fmt::v5::char8_t>::operator()
                  ((str_writer<fmt::v5::char8_t> *)this_00,in_stack_ffffffffffffff88);
        pcVar4 = std::fill_n<fmt::v5::char8_t*,unsigned_long,fmt::v5::char8_t>
                           ((char8_t *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),__n,
                            in_stack_ffffffffffffffa0);
        *local_40 = pcVar4;
      }
    }
  }
  else {
    local_38 = basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>_>_>
               ::reserve(this_00,(size_t)local_18);
    str_writer<fmt::v5::char8_t>::operator()((str_writer<fmt::v5::char8_t> *)this_00,&local_18->s);
  }
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }